

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

bool read_char_from_FILE(char *ch,FILE *f)

{
  int iVar1;
  size_t sVar2;
  runtime_error *this;
  
  sVar2 = fread(ch,1,1,(FILE *)f);
  if (sVar2 == 0) {
    iVar1 = ferror((FILE *)f);
    if (iVar1 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"failure reading character from file");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return sVar2 != 0;
}

Assistant:

static bool
read_char_from_FILE(char& ch, FILE* f)
{
    auto len = fread(&ch, 1, 1, f);
    if (len == 0) {
        if (ferror(f)) {
            throw std::runtime_error("failure reading character from file");
        }
        return false;
    }
    return true;
}